

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall Matrix::ApplyColumnPermutation(Matrix *this,Permutation *permutation)

{
  bool bVar1;
  int iVar2;
  int source_column;
  bool bVar3;
  int column;
  Matrix result;
  Matrix local_60;
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  local_40;
  
  iVar2 = Permutation::Size(permutation);
  if (iVar2 == this->m_) {
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::vector(&local_40,&this->elements_);
    Matrix(&local_60,&local_40);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&local_40);
    bVar3 = false;
    for (iVar2 = 0; iVar2 < this->m_; iVar2 = iVar2 + 1) {
      source_column = Permutation::At(permutation,iVar2);
      bVar1 = CopyColumn(&local_60,this,source_column,iVar2);
      bVar3 = (bool)(bVar3 | bVar1);
    }
    operator=(this,&local_60);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&local_60.elements_);
    return bVar3;
  }
  __assert_fail("permutation.Size() == m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/matrix.cpp"
                ,0x179,"bool Matrix::ApplyColumnPermutation(const Permutation &)");
}

Assistant:

bool Matrix::ApplyColumnPermutation(const Permutation& permutation) {
  assert(permutation.Size() == m_);
  Matrix result(elements_);
  bool answer = false;
  for (int column = 0; column < m_; ++column) {
    answer |= result.CopyColumn(*this, permutation.At(column), column);
  }
  operator=(result);

  return answer;
}